

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5FindTokenizer_v2
              (fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer_v2 **ppTokenizer)

{
  int iVar1;
  Fts5TokenizerModule *pFVar2;
  Fts5TokenizerModule *pFVar3;
  
  pFVar2 = fts5LocateTokenizer((Fts5Global *)pApi,zName);
  if (pFVar2 == (Fts5TokenizerModule *)0x0) {
    *ppTokenizer = (fts5_tokenizer_v2 *)0x0;
    *ppUserData = (void *)0x0;
    iVar1 = 1;
  }
  else {
    pFVar3 = pFVar2;
    if (pFVar2->bV2Native != 0) {
      pFVar3 = (Fts5TokenizerModule *)pFVar2->pUserData;
    }
    *ppUserData = pFVar3;
    *ppTokenizer = &pFVar2->x2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fts5FindTokenizer_v2(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of tokenizer */
  void **ppUserData,
  fts5_tokenizer_v2 **ppTokenizer /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    if( pMod->bV2Native ){
      *ppUserData = pMod->pUserData;
    }else{
      *ppUserData = (void*)pMod;
    }
    *ppTokenizer = &pMod->x2;
  }else{
    *ppTokenizer = 0;
    *ppUserData = 0;
    rc = SQLITE_ERROR;
  }

  return rc;
}